

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioNative.cpp
# Opt level: O0

void chatra::emb::io::fileInputStream_seek(Ct *ct)

{
  int iVar1;
  SeekOrigin SVar2;
  pointer pIVar3;
  undefined4 extraout_var;
  long lVar4;
  lock_guard<std::mutex> local_20;
  lock_guard<std::mutex> lock;
  FileInputStreamData *self;
  Ct *ct_local;
  
  lock._M_device = (mutex_type *)derefSelfAsInput(ct);
  std::lock_guard<std::mutex>::lock_guard(&local_20,&((FileInputStreamData *)lock._M_device)->mt);
  pIVar3 = std::unique_ptr<chatra::IFile,_std::default_delete<chatra::IFile>_>::operator->
                     ((unique_ptr<chatra::IFile,_std::default_delete<chatra::IFile>_> *)
                      ((long)&lock._M_device[1].super___mutex_base._M_mutex + 0x10));
  iVar1 = (*ct->_vptr_NativeCallContext[10])(ct,0);
  lVar4 = NativeReference::get<long,_nullptr>((NativeReference *)CONCAT44(extraout_var,iVar1));
  SVar2 = parseOrigin(ct,1);
  (*pIVar3->_vptr_IFile[6])(pIVar3,lVar4,(ulong)SVar2);
  std::lock_guard<std::mutex>::~lock_guard(&local_20);
  return;
}

Assistant:

static void fileInputStream_seek(Ct& ct) {
	auto* self = derefSelfAsInput(ct);
	std::lock_guard<std::mutex> lock(self->mt);
	self->file->seek(ct.at(0).get<ptrdiff_t>(), parseOrigin(ct, 1));
}